

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall
QString::repeated(QString *__return_storage_ptr__,QString *this,qsizetype times)

{
  char16_t *__dest;
  long lVar1;
  size_t sVar2;
  Data *pDVar3;
  qsizetype alloc;
  long lVar4;
  long in_FS_OFFSET;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (this->d).size;
  if (lVar4 == 0) {
    pDVar3 = (this->d).d;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = (this->d).ptr;
    (__return_storage_ptr__->d).size = 0;
LAB_0032e8f3:
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    if (times < 2) {
      if (times != 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
          (__return_storage_ptr__->d).size = 0;
          return __return_storage_ptr__;
        }
        goto LAB_0032ea76;
      }
      pDVar3 = (this->d).d;
      (__return_storage_ptr__->d).d = pDVar3;
      (__return_storage_ptr__->d).ptr = (this->d).ptr;
      (__return_storage_ptr__->d).size = lVar4;
      goto LAB_0032e8f3;
    }
    lVar4 = lVar4 * times;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_58.d.size = 0;
    alloc = 0;
    if (0 < lVar4) {
      alloc = lVar4;
    }
    reallocData(&local_58,alloc,KeepSize);
    if (&(local_58.d.d)->super_QArrayData == (QArrayData *)0x0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      lVar1 = *(qsizetype *)((long)local_58.d.d + 8);
      if (lVar1 != 0) {
        *(byte *)&(((ArrayOptions *)((long)local_58.d.d + 4))->
                  super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(((ArrayOptions *)((long)local_58.d.d + 4))->
                   super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      if (lVar1 == lVar4) {
        memcpy(local_58.d.ptr,(this->d).ptr,(this->d).size * 2);
        sVar2 = (this->d).size;
        __dest = local_58.d.ptr + sVar2;
        while ((long)sVar2 <= lVar4 >> 1) {
          memcpy(__dest,local_58.d.ptr,sVar2 * 2);
          __dest = __dest + sVar2;
          sVar2 = sVar2 * 2;
        }
        memcpy(__dest,local_58.d.ptr,(lVar4 - sVar2) * 2);
        local_58.d.ptr[lVar4] = L'\0';
        (__return_storage_ptr__->d).d = local_58.d.d;
        (__return_storage_ptr__->d).ptr = local_58.d.ptr;
        (__return_storage_ptr__->d).size = lVar4;
      }
      else {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0032ea76:
  __stack_chk_fail();
}

Assistant:

QString QString::repeated(qsizetype times) const
{
    if (d.size == 0)
        return *this;

    if (times <= 1) {
        if (times == 1)
            return *this;
        return QString();
    }

    const qsizetype resultSize = times * d.size;

    QString result;
    result.reserve(resultSize);
    if (result.capacity() != resultSize)
        return QString(); // not enough memory

    memcpy(result.d.data(), d.data(), d.size * sizeof(QChar));

    qsizetype sizeSoFar = d.size;
    char16_t *end = result.d.data() + sizeSoFar;

    const qsizetype halfResultSize = resultSize >> 1;
    while (sizeSoFar <= halfResultSize) {
        memcpy(end, result.d.data(), sizeSoFar * sizeof(QChar));
        end += sizeSoFar;
        sizeSoFar <<= 1;
    }
    memcpy(end, result.d.data(), (resultSize - sizeSoFar) * sizeof(QChar));
    result.d.data()[resultSize] = '\0';
    result.d.size = resultSize;
    return result;
}